

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O2

bool implementations::scheme::SchemeDispatcher<(implementations::scheme::instruction::instruction)2>
     ::dispatch(SchemeFrame *frame,const_iterator it)

{
  cell *pcVar1;
  cell *this;
  
  pcVar1 = cell::operator=(&(frame->
                            super_Frame<implementations::scheme::cell,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::environment>
                            ).result,it._M_current + 1);
  this = SchemeFrame::lookup(frame,&(it._M_current)->val);
  cell::operator=(this,pcVar1);
  return true;
}

Assistant:

static bool dispatch(SchemeFrame &frame, cells::const_iterator it) {
		const cell &var = *it; ++it;
		const cell &val = *it; ++it;
		frame.lookup(var.val) = frame.result = val;
		return true;
	}